

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::text_format_unittest::TextFormatTest_PrintExotic_Test::TestBody
          (TextFormatTest_PrintExotic_Test *this)

{
  bool bVar1;
  char *message_00;
  AlphaNum *b;
  double dVar2;
  string_view text;
  AssertHelper local_478;
  Message local_470;
  string local_468;
  undefined1 local_448 [16];
  string local_438;
  AlphaNum local_418;
  AlphaNum local_3e8;
  string local_3b8;
  undefined1 local_398 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  undefined1 local_350 [8];
  TestAllTypes message;
  TextFormatTest_PrintExotic_Test *this_local;
  
  message.field_0._808_8_ = this;
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_350);
  proto2_unittest::TestAllTypes::add_repeated_int64((TestAllTypes *)local_350,-0x8000000000000000);
  proto2_unittest::TestAllTypes::add_repeated_uint64((TestAllTypes *)local_350,0xffffffffffffffff);
  proto2_unittest::TestAllTypes::add_repeated_double((TestAllTypes *)local_350,123.456);
  proto2_unittest::TestAllTypes::add_repeated_double((TestAllTypes *)local_350,1.23e+21);
  proto2_unittest::TestAllTypes::add_repeated_double((TestAllTypes *)local_350,1.23e-18);
  dVar2 = std::numeric_limits<double>::infinity();
  proto2_unittest::TestAllTypes::add_repeated_double((TestAllTypes *)local_350,dVar2);
  dVar2 = std::numeric_limits<double>::infinity();
  proto2_unittest::TestAllTypes::add_repeated_double((TestAllTypes *)local_350,-dVar2);
  dVar2 = std::numeric_limits<double>::quiet_NaN();
  proto2_unittest::TestAllTypes::add_repeated_double((TestAllTypes *)local_350,dVar2);
  dVar2 = std::numeric_limits<double>::quiet_NaN();
  proto2_unittest::TestAllTypes::add_repeated_double((TestAllTypes *)local_350,-dVar2);
  dVar2 = std::numeric_limits<double>::signaling_NaN();
  proto2_unittest::TestAllTypes::add_repeated_double((TestAllTypes *)local_350,dVar2);
  dVar2 = std::numeric_limits<double>::signaling_NaN();
  proto2_unittest::TestAllTypes::add_repeated_double((TestAllTypes *)local_350,-dVar2);
  b = (AlphaNum *)
      ((long)&gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      + 7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_380,"",0xc,(allocator *)b);
  proto2_unittest::TestAllTypes::add_repeated_string<std::__cxx11::string>
            ((TestAllTypes *)local_350,&local_380);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
            (&local_3e8,
             &(this->super_TextFormatTest).super_TextFormatTestBase.multi_line_debug_format_prefix_)
  ;
  absl::lts_20250127::AlphaNum::AlphaNum
            (&local_418,
             "repeated_int64: -9223372036854775808\nrepeated_uint64: 18446744073709551615\nrepeated_double: 123.456\nrepeated_double: 1.23e+21\nrepeated_double: 1.23e-18\nrepeated_double: inf\nrepeated_double: -inf\nrepeated_double: nan\nrepeated_double: nan\nrepeated_double: nan\nrepeated_double: nan\nrepeated_string: \"\\000\\001\\007\\010\\014\\n\\r\\t\\013\\\\\\\'\\\"\"\n"
            );
  absl::lts_20250127::StrCat_abi_cxx11_(&local_3b8,(lts_20250127 *)&local_3e8,&local_418,b);
  Message::DebugString_abi_cxx11_(&local_468,(Message *)local_350);
  local_448 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_468);
  text._M_len = local_448._8_8_;
  text._M_str = (char *)b;
  RemoveRedundantZeros_abi_cxx11_(&local_438,local_448._0_8_,text);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_398,
             "absl::StrCat(multi_line_debug_format_prefix_, \"repeated_int64: -9223372036854775808\\n\" \"repeated_uint64: 18446744073709551615\\n\" \"repeated_double: 123.456\\n\" \"repeated_double: 1.23e+21\\n\" \"repeated_double: 1.23e-18\\n\" \"repeated_double: inf\\n\" \"repeated_double: -inf\\n\" \"repeated_double: nan\\n\" \"repeated_double: nan\\n\" \"repeated_double: nan\\n\" \"repeated_double: nan\\n\" \"repeated_string: \" \"\\\"\\\\000\\\\001\\\\007\\\\010\\\\014\\\\n\\\\r\\\\t\\\\013\\\\\\\\\\\\\'\\\\\\\"\\\"\\n\")"
             ,"RemoveRedundantZeros(message.DebugString())",&local_3b8,&local_438);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_3b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
  if (!bVar1) {
    testing::Message::Message(&local_470);
    message_00 = testing::AssertionResult::failure_message((AssertionResult *)local_398);
    testing::internal::AssertHelper::AssertHelper
              (&local_478,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0x5fb,message_00);
    testing::internal::AssertHelper::operator=(&local_478,&local_470);
    testing::internal::AssertHelper::~AssertHelper(&local_478);
    testing::Message::~Message(&local_470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_350);
  return;
}

Assistant:

TEST_F(TextFormatTest, PrintExotic) {
  unittest::TestAllTypes message;

  message.add_repeated_int64(int64_t{-9223372036854775807} - 1);
  message.add_repeated_uint64(uint64_t{18446744073709551615u});
  message.add_repeated_double(123.456);
  message.add_repeated_double(1.23e21);
  message.add_repeated_double(1.23e-18);
  message.add_repeated_double(std::numeric_limits<double>::infinity());
  message.add_repeated_double(-std::numeric_limits<double>::infinity());
  message.add_repeated_double(std::numeric_limits<double>::quiet_NaN());
  message.add_repeated_double(-std::numeric_limits<double>::quiet_NaN());
  message.add_repeated_double(std::numeric_limits<double>::signaling_NaN());
  message.add_repeated_double(-std::numeric_limits<double>::signaling_NaN());
  message.add_repeated_string(std::string("\000\001\a\b\f\n\r\t\v\\\'\"", 12));

  // Fun story:  We used to use 1.23e22 instead of 1.23e21 above, but this
  //   seemed to trigger an odd case on MinGW/GCC 3.4.5 where GCC's parsing of
  //   the value differed from strtod()'s parsing.  That is to say, the
  //   following assertion fails on MinGW:
  //     assert(1.23e22 == strtod("1.23e22", nullptr));
  //   As a result, SimpleDtoa() would print the value as
  //   "1.2300000000000001e+22" to make sure strtod() produce the exact same
  //   result.  Our goal is to test runtime parsing, not compile-time parsing,
  //   so this wasn't our problem.  It was found that using 1.23e21 did not
  //   have this problem, so we switched to that instead.

  EXPECT_EQ(
      absl::StrCat(multi_line_debug_format_prefix_,
                   "repeated_int64: -9223372036854775808\n"
                   "repeated_uint64: 18446744073709551615\n"
                   "repeated_double: 123.456\n"
                   "repeated_double: 1.23e+21\n"
                   "repeated_double: 1.23e-18\n"
                   "repeated_double: inf\n"
                   "repeated_double: -inf\n"
                   "repeated_double: nan\n"
                   "repeated_double: nan\n"
                   "repeated_double: nan\n"
                   "repeated_double: nan\n"
                   "repeated_string: "
                   "\"\\000\\001\\007\\010\\014\\n\\r\\t\\013\\\\\\'\\\"\"\n"),
      RemoveRedundantZeros(message.DebugString()));
}